

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

int ssl_resend_hello_request(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_config *pmVar1;
  uint uVar2;
  ulong in_RAX;
  int iVar3;
  undefined8 in_R9;
  
  pmVar1 = ssl->conf;
  if (pmVar1->renego_max_records < 0) {
    iVar3 = 1;
    for (uVar2 = pmVar1->hs_timeout_max / pmVar1->hs_timeout_min + 1; uVar2 != 0; uVar2 = uVar2 >> 1
        ) {
      iVar3 = iVar3 + 1;
    }
    uVar2 = ssl->renego_records_seen;
    in_RAX = (ulong)uVar2;
    ssl->renego_records_seen = uVar2 + 1;
    if (iVar3 <= (int)uVar2) {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                 ,0x87c,"no longer retransmitting hello request",in_R9,in_RAX);
      return 0;
    }
  }
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x1844,"=> write hello request",in_R9,in_RAX);
  ssl->out_msglen = 4;
  ssl->out_msgtype = 0x16;
  *ssl->out_msg = '\0';
  iVar3 = mbedtls_ssl_write_record(ssl);
  if (iVar3 == 0) {
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x1850,"<= write hello request");
  }
  else {
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
               ,0x184c,"mbedtls_ssl_write_record",iVar3);
  }
  return iVar3;
}

Assistant:

static int ssl_resend_hello_request( mbedtls_ssl_context *ssl )
{
    /* If renegotiation is not enforced, retransmit until we would reach max
     * timeout if we were using the usual handshake doubling scheme */
    if( ssl->conf->renego_max_records < 0 )
    {
        uint32_t ratio = ssl->conf->hs_timeout_max / ssl->conf->hs_timeout_min + 1;
        unsigned char doublings = 1;

        while( ratio != 0 )
        {
            ++doublings;
            ratio >>= 1;
        }

        if( ++ssl->renego_records_seen > doublings )
        {
            MBEDTLS_SSL_DEBUG_MSG( 2, ( "no longer retransmitting hello request" ) );
            return( 0 );
        }
    }

    return( ssl_write_hello_request( ssl ) );
}